

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O1

void miniros::serialization::Serializer<rosgraph_msgs::Log_<std::allocator<void>>>::
     allInOne<miniros::serialization::OStream,rosgraph_msgs::Log_<std::allocator<void>>const&>
               (OStream *stream,Log_<std::allocator<void>_> *m)

{
  _seq_type *p_Var1;
  uint32_t *puVar2;
  _line_type *p_Var3;
  uint8_t uVar4;
  _seq_type _Var5;
  uint32_t uVar6;
  _line_type _Var7;
  _seq_type *p_Var8;
  uint32_t *puVar9;
  ulong uVar10;
  uint8_t *puVar11;
  _line_type *p_Var12;
  pointer pbVar13;
  uint8_t *puVar14;
  pointer pbVar15;
  
  _Var5 = (m->header).seq;
  p_Var8 = (_seq_type *)(stream->super_Stream).data_;
  p_Var1 = p_Var8 + 1;
  (stream->super_Stream).data_ = (uint8_t *)p_Var1;
  if ((stream->super_Stream).end_ < p_Var1) {
    throwStreamOverrun();
  }
  *p_Var8 = _Var5;
  uVar6 = (m->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration>.sec;
  puVar9 = (uint32_t *)(stream->super_Stream).data_;
  puVar2 = puVar9 + 1;
  (stream->super_Stream).data_ = (uint8_t *)puVar2;
  if ((stream->super_Stream).end_ < puVar2) {
    throwStreamOverrun();
  }
  *puVar9 = uVar6;
  uVar6 = (m->header).stamp.super_TimeBase<miniros::Time,_miniros::Duration>.nsec;
  puVar9 = (uint32_t *)(stream->super_Stream).data_;
  puVar2 = puVar9 + 1;
  (stream->super_Stream).data_ = (uint8_t *)puVar2;
  if ((stream->super_Stream).end_ < puVar2) {
    throwStreamOverrun();
  }
  *puVar9 = uVar6;
  uVar10 = (m->header).frame_id._M_string_length;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)uVar10;
  if (uVar10 != 0) {
    puVar11 = (stream->super_Stream).data_;
    puVar14 = puVar11 + (uVar10 & 0xffffffff);
    (stream->super_Stream).data_ = puVar14;
    if ((stream->super_Stream).end_ < puVar14) {
      throwStreamOverrun();
    }
    memcpy(puVar11,(m->header).frame_id._M_dataplus._M_p,uVar10);
  }
  uVar4 = m->level;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 1;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *puVar14 = uVar4;
  uVar10 = (m->name)._M_string_length;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)uVar10;
  if (uVar10 != 0) {
    puVar11 = (stream->super_Stream).data_;
    puVar14 = puVar11 + (uVar10 & 0xffffffff);
    (stream->super_Stream).data_ = puVar14;
    if ((stream->super_Stream).end_ < puVar14) {
      throwStreamOverrun();
    }
    memcpy(puVar11,(m->name)._M_dataplus._M_p,uVar10);
  }
  uVar10 = (m->msg)._M_string_length;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)uVar10;
  if (uVar10 != 0) {
    puVar11 = (stream->super_Stream).data_;
    puVar14 = puVar11 + (uVar10 & 0xffffffff);
    (stream->super_Stream).data_ = puVar14;
    if ((stream->super_Stream).end_ < puVar14) {
      throwStreamOverrun();
    }
    memcpy(puVar11,(m->msg)._M_dataplus._M_p,uVar10);
  }
  uVar10 = (m->file)._M_string_length;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)uVar10;
  if (uVar10 != 0) {
    puVar11 = (stream->super_Stream).data_;
    puVar14 = puVar11 + (uVar10 & 0xffffffff);
    (stream->super_Stream).data_ = puVar14;
    if ((stream->super_Stream).end_ < puVar14) {
      throwStreamOverrun();
    }
    memcpy(puVar11,(m->file)._M_dataplus._M_p,uVar10);
  }
  uVar10 = (m->function)._M_string_length;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)uVar10;
  if (uVar10 != 0) {
    puVar11 = (stream->super_Stream).data_;
    puVar14 = puVar11 + (uVar10 & 0xffffffff);
    (stream->super_Stream).data_ = puVar14;
    if ((stream->super_Stream).end_ < puVar14) {
      throwStreamOverrun();
    }
    memcpy(puVar11,(m->function)._M_dataplus._M_p,uVar10);
  }
  _Var7 = m->line;
  p_Var12 = (_line_type *)(stream->super_Stream).data_;
  p_Var3 = p_Var12 + 1;
  (stream->super_Stream).data_ = (uint8_t *)p_Var3;
  if ((stream->super_Stream).end_ < p_Var3) {
    throwStreamOverrun();
  }
  *p_Var12 = _Var7;
  pbVar15 = (m->topics).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar13 = (m->topics).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar14 = (stream->super_Stream).data_;
  puVar11 = puVar14 + 4;
  (stream->super_Stream).data_ = puVar11;
  if ((stream->super_Stream).end_ < puVar11) {
    throwStreamOverrun();
  }
  *(int *)puVar14 = (int)((ulong)((long)pbVar15 - (long)pbVar13) >> 5);
  pbVar13 = (m->topics).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar15 = (m->topics).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar13;
      pbVar15 = pbVar15 + 1) {
    uVar10 = pbVar15->_M_string_length;
    puVar14 = (stream->super_Stream).data_;
    puVar11 = puVar14 + 4;
    (stream->super_Stream).data_ = puVar11;
    if ((stream->super_Stream).end_ < puVar11) {
      throwStreamOverrun();
    }
    *(int *)puVar14 = (int)uVar10;
    if (uVar10 != 0) {
      puVar11 = (stream->super_Stream).data_;
      puVar14 = puVar11 + (uVar10 & 0xffffffff);
      (stream->super_Stream).data_ = puVar14;
      if ((stream->super_Stream).end_ < puVar14) {
        throwStreamOverrun();
      }
      memcpy(puVar11,(pbVar15->_M_dataplus)._M_p,uVar10);
    }
  }
  return;
}

Assistant:

inline static void allInOne(Stream& stream, T m)
    {
      stream.next(m.header);
      stream.next(m.level);
      stream.next(m.name);
      stream.next(m.msg);
      stream.next(m.file);
      stream.next(m.function);
      stream.next(m.line);
      stream.next(m.topics);
    }